

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O2

bool __thiscall
google::
dense_hashtable<int,int,TransparentHasher,Negation<int>,SetKey<int,Negation<int>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
::serialize<ValueSerializer,_IO_FILE>
          (dense_hashtable<int,int,TransparentHasher,Negation<int>,SetKey<int,Negation<int>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
           *this,_IO_FILE *param_2)

{
  int iVar1;
  byte bVar2;
  bool bVar3;
  long lVar4;
  int iVar5;
  byte bVar6;
  ulong uVar7;
  long lVar8;
  int bit;
  long lVar9;
  uchar bits;
  ValueSerializer local_31;
  
  dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted((dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)this);
  bVar3 = sparsehash_internal::write_bigendian_number<_IO_FILE,unsigned_long>(param_2,0x13578642,4);
  if (((bVar3) &&
      (bVar3 = sparsehash_internal::write_bigendian_number<_IO_FILE,unsigned_long>
                         (param_2,*(unsigned_long *)(this + 0x58),8), bVar3)) &&
     (bVar3 = sparsehash_internal::write_bigendian_number<_IO_FILE,unsigned_long>
                        (param_2,*(unsigned_long *)(this + 0x50),8), bVar3)) {
    lVar8 = 0;
    uVar7 = 0;
    while( true ) {
      if (*(ulong *)(this + 0x58) <= uVar7) {
        return true;
      }
      bVar2 = 0;
      iVar5 = *(int *)(this + 0x38);
      bVar6 = 0;
      for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
        if (uVar7 + lVar4 < *(ulong *)(this + 0x58)) {
          iVar5 = iVar5 + 1;
          iVar1 = *(int *)(*(long *)(this + 0x70) + lVar8 + lVar4 * 4);
          *(int *)(this + 0x38) = iVar5;
          if (iVar1 + *(int *)(this + 0x40) != 0) {
            bVar6 = bVar6 | (byte)(1 << ((byte)lVar4 & 0x1f));
            bVar2 = bVar6;
          }
        }
      }
      bVar3 = sparsehash_internal::write_data<_IO_FILE>(param_2,&bits,1);
      if (!bVar3) break;
      lVar4 = lVar8;
      for (lVar9 = 0; lVar9 != 8; lVar9 = lVar9 + 1) {
        if (((bVar2 >> ((uint)lVar9 & 0x1f) & 1) != 0) &&
           (bVar3 = ValueSerializer::operator()
                              (&local_31,param_2,(int *)(*(long *)(this + 0x70) + lVar4)), !bVar3))
        {
          return false;
        }
        lVar4 = lVar4 + 4;
      }
      uVar7 = uVar7 + 8;
      lVar8 = lVar8 + 0x20;
    }
  }
  return false;
}

Assistant:

bool serialize(ValueSerializer serializer, OUTPUT* fp) {
    squash_deleted();  // so we don't have to worry about delkey
    if (!sparsehash_internal::write_bigendian_number(fp, MAGIC_NUMBER, 4))
      return false;
    if (!sparsehash_internal::write_bigendian_number(fp, num_buckets, 8))
      return false;
    if (!sparsehash_internal::write_bigendian_number(fp, num_elements, 8))
      return false;
    // Now write a bitmap of non-empty buckets.
    for (size_type i = 0; i < num_buckets; i += 8) {
      unsigned char bits = 0;
      for (int bit = 0; bit < 8; ++bit) {
        if (i + bit < num_buckets && !test_empty(i + bit)) bits |= (1 << bit);
      }
      if (!sparsehash_internal::write_data(fp, &bits, sizeof(bits)))
        return false;
      for (int bit = 0; bit < 8; ++bit) {
        if (bits & (1 << bit)) {
          if (!serializer(fp, table[i + bit])) return false;
        }
      }
    }
    return true;
  }